

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O3

void __thiscall V2MPlayer::Stop(V2MPlayer *this,uint32_t a_fadetime)

{
  if ((this->m_base).valid == true) {
    if (a_fadetime != 0) {
      this->m_fadedelta =
           this->m_fadeval /
           (float)(((ulong)this->m_samplerate * (ulong)a_fadetime) / (ulong)this->m_tpc & 0xffffffff
                  );
      return;
    }
    (this->m_state).state = OFF;
  }
  return;
}

Assistant:

void V2MPlayer::Stop(uint32_t a_fadetime)
{
    if (!m_base.valid)
        return;

    if (a_fadetime)
    {
        uint32_t ftsmpls = ((uint64_t)a_fadetime * m_samplerate) / m_tpc;
        m_fadedelta = m_fadeval/ftsmpls;
    } else
        m_state.state=PlayerState::OFF;
}